

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O2

void * sx__aligned_realloc(sx_alloc *alloc,void *ptr,size_t size,uint32_t align,char *file,
                          char *func,uint32_t line)

{
  uint uVar1;
  code *pcVar2;
  void *pvVar3;
  ulong uVar4;
  void *__dest;
  
  uVar1 = *(uint *)((long)ptr + -4);
  uVar4 = 8;
  if (8 < (int)align) {
    uVar4 = (ulong)align;
  }
  pvVar3 = (*alloc->alloc_cb)((void *)((long)ptr - (ulong)uVar1),size + uVar4 + 4,0,file,func,line,
                              alloc->user_data);
  if (pvVar3 == (void *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/allocator.h"
                      ,0xcd,"ptr");
    pcVar2 = (code *)swi(3);
    pvVar3 = (void *)(*pcVar2)();
    return pvVar3;
  }
  uVar4 = (ulong)((int)uVar4 - 1);
  __dest = (void *)(~uVar4 & (long)pvVar3 + uVar4 + 4);
  if (__dest != ptr) {
    memmove(__dest,(void *)((ulong)uVar1 + (long)pvVar3),size);
    *(int *)((long)__dest + -4) = (int)__dest - (int)pvVar3;
    ptr = __dest;
  }
  return ptr;
}

Assistant:

SX_INLINE void* sx__aligned_realloc(const sx_alloc* alloc, void* ptr, size_t size, uint32_t align, 
                                    const char* file, const char* func, uint32_t line)
{
    if (ptr == NULL)
        return sx__aligned_alloc(alloc, size, align, file, func, line);

    uint8_t* aligned = (uint8_t*)ptr;
    uint32_t offset = *((uint32_t*)aligned - 1);
    ptr = aligned - offset;

    align = sx_max((int)align, SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT);
    const size_t total = size + align + sizeof(uint32_t);
    ptr = sx__realloc(alloc, ptr, total, 0, file, func, line);
    sx_assert(ptr);
    uint8_t* new_aligned = (uint8_t*)sx_align_ptr(ptr, sizeof(uint32_t), align);

    if (new_aligned == aligned)
        return aligned;

    aligned = (uint8_t*)ptr + offset;
    sx_memmove(new_aligned, aligned, size);
    uint32_t* header = (uint32_t*)new_aligned - 1;
    *header = (uint32_t)(new_aligned - (uint8_t*)ptr);
    return new_aligned;
}